

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,uchar *bytes_to_encode,size_t in_len)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 local_3b [3];
  uchar char_array_4 [4];
  ulong uStack_38;
  uchar char_array_3 [3];
  size_t j;
  size_t i;
  size_t local_20;
  size_t in_len_local;
  uchar *bytes_to_encode_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  j = 0;
  uStack_38 = 0;
  local_20 = in_len;
  in_len_local = (size_t)bytes_to_encode;
  while (sVar2 = local_20 - 1, local_20 != 0) {
    sVar3 = in_len_local + 1;
    sVar4 = j + 1;
    local_3b[j] = *(undefined1 *)in_len_local;
    j = sVar4;
    local_20 = sVar2;
    in_len_local = sVar3;
    if (sVar4 == 3) {
      for (j = 0; j < 4; j = j + 1) {
        pcVar1 = (char *)std::__cxx11::string::operator[](0x148890);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
      }
      j = 0;
    }
  }
  if (j != 0) {
    for (uStack_38 = j; uStack_38 < 3; uStack_38 = uStack_38 + 1) {
      local_3b[uStack_38] = 0;
    }
    for (uStack_38 = 0; uStack_38 < j + 1; uStack_38 = uStack_38 + 1) {
      pcVar1 = (char *)std::__cxx11::string::operator[](0x148890);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
    }
    while (j < 3) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
      j = j + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const unsigned char* bytes_to_encode, std::size_t in_len) {
		std::string ret;
		std::size_t i = 0;
		std::size_t j = 0;

		unsigned char char_array_3[3];
		unsigned char char_array_4[4];

		while (in_len--) {
			char_array_3[i++] = *(bytes_to_encode++);
			if (i == 3) {
				char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
				char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
				char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
				char_array_4[3] = char_array_3[2] & 0x3f;

				for (i = 0; (i < 4); i++)
					ret += base64_chars[char_array_4[i]];
				i = 0;
			}
		}

		if (i)
		{
			for (j = i; j < 3; j++)
				char_array_3[j] = '\0';

			char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
			char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
			char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);

			for (j = 0; (j < i + 1); j++)
				ret += base64_chars[char_array_4[j]];

			while ((i++ < 3))
				ret += '=';

		}
		return ret;
	}